

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __thiscall
utf8::
utf8to32<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (utf8 *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          start,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,
          back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> result)

{
  bool bVar1;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  uint32_t local_2c;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_28;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> result_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start_local;
  
  local_28.container = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)end._M_current;
  result_local.container = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)start._M_current;
  end_local._M_current = (char *)this;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end_local,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&result_local);
    if (!bVar1) break;
    local_38 = result_local.container;
    local_2c = next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (&end_local,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )result_local.container);
    local_40 = std::back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator++(&local_28,0);
    this_00 = std::back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator*(&local_40);
    std::back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
              (this_00,&local_2c);
  }
  return (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
         local_28.container;
}

Assistant:

u32bit_iterator utf8to32 (octet_iterator start, octet_iterator end, u32bit_iterator result)
    {
        while (start != end)
            (*result++) = utf8::next(start, end);

        return result;
    }